

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line_to_triplet<charls::transform_hp1<unsigned_char>::inverse,unsigned_char>
               (uchar *source,size_t pixel_stride_in,triplet<unsigned_char> *destination,
               size_t pixel_stride,inverse *transform)

{
  triplet<unsigned_char> tVar1;
  size_t sVar2;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  for (sVar2 = 0; pixel_stride != sVar2; sVar2 = sVar2 + 1) {
    tVar1 = transform_hp1<unsigned_char>::inverse::operator()
                      (transform,(uint)source[sVar2],(uint)source[sVar2 + pixel_stride_in],
                       (uint)source[sVar2 + pixel_stride_in * 2]);
    destination->field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)(char)tVar1._0_2_;
    destination->field_1 =
         (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)(char)((ushort)tVar1._0_2_ >> 8);
    (destination->field_2).v3 = (uchar)tVar1.field_2;
    destination = destination + 1;
  }
  return;
}

Assistant:

void transform_line_to_triplet(const PixelType* source, const size_t pixel_stride_in, triplet<PixelType>* destination,
                               const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    triplet<PixelType>* type_buffer = destination;

    for (size_t i{}; i < pixel_count; ++i)
    {
        type_buffer[i] = transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]);
    }
}